

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseEncodingDecl(xmlParserCtxtPtr ctxt)

{
  bool bVar1;
  xmlChar *local_20;
  xmlChar *encoding;
  xmlParserCtxtPtr ctxt_local;
  
  local_20 = (xmlChar *)0x0;
  xmlSkipBlankChars(ctxt);
  bVar1 = false;
  if ((((*ctxt->input->cur == 'e') && (bVar1 = false, ctxt->input->cur[1] == 'n')) &&
      (bVar1 = false, ctxt->input->cur[2] == 'c')) &&
     (((bVar1 = false, ctxt->input->cur[3] == 'o' && (bVar1 = false, ctxt->input->cur[4] == 'd')) &&
      ((bVar1 = false, ctxt->input->cur[5] == 'i' && (bVar1 = false, ctxt->input->cur[6] == 'n')))))
     ) {
    bVar1 = ctxt->input->cur[7] == 'g';
  }
  if (bVar1) {
    ctxt->input->cur = ctxt->input->cur + 8;
    ctxt->input->col = ctxt->input->col + 8;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankChars(ctxt);
    if (*ctxt->input->cur == '=') {
      xmlNextChar(ctxt);
      xmlSkipBlankChars(ctxt);
      if (*ctxt->input->cur == '\"') {
        xmlNextChar(ctxt);
        local_20 = xmlParseEncName(ctxt);
        if (*ctxt->input->cur != '\"') {
          xmlFatalErr(ctxt,XML_ERR_STRING_NOT_CLOSED,(char *)0x0);
          (*xmlFree)(local_20);
          return (xmlChar *)0x0;
        }
        xmlNextChar(ctxt);
      }
      else if (*ctxt->input->cur == '\'') {
        xmlNextChar(ctxt);
        local_20 = xmlParseEncName(ctxt);
        if (*ctxt->input->cur != '\'') {
          xmlFatalErr(ctxt,XML_ERR_STRING_NOT_CLOSED,(char *)0x0);
          (*xmlFree)(local_20);
          return (xmlChar *)0x0;
        }
        xmlNextChar(ctxt);
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_STRING_NOT_STARTED,(char *)0x0);
      }
      if (local_20 == (xmlChar *)0x0) {
        ctxt_local = (xmlParserCtxtPtr)0x0;
      }
      else {
        xmlSetDeclaredEncoding(ctxt,local_20);
        ctxt_local = (xmlParserCtxtPtr)ctxt->encoding;
      }
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_EQUAL_REQUIRED,(char *)0x0);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

const xmlChar *
xmlParseEncodingDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *encoding = NULL;

    SKIP_BLANKS;
    if (CMP8(CUR_PTR, 'e', 'n', 'c', 'o', 'd', 'i', 'n', 'g') == 0)
        return(NULL);

    SKIP(8);
    SKIP_BLANKS;
    if (RAW != '=') {
        xmlFatalErr(ctxt, XML_ERR_EQUAL_REQUIRED, NULL);
        return(NULL);
    }
    NEXT;
    SKIP_BLANKS;
    if (RAW == '"') {
        NEXT;
        encoding = xmlParseEncName(ctxt);
        if (RAW != '"') {
            xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
            xmlFree((xmlChar *) encoding);
            return(NULL);
        } else
            NEXT;
    } else if (RAW == '\''){
        NEXT;
        encoding = xmlParseEncName(ctxt);
        if (RAW != '\'') {
            xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
            xmlFree((xmlChar *) encoding);
            return(NULL);
        } else
            NEXT;
    } else {
        xmlFatalErr(ctxt, XML_ERR_STRING_NOT_STARTED, NULL);
    }

    if (encoding == NULL)
        return(NULL);

    xmlSetDeclaredEncoding(ctxt, encoding);

    return(ctxt->encoding);
}